

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * __thiscall CTape::produce(string *__return_storage_ptr__,CTape *this,string *phrase)

{
  pointer pcVar1;
  ulong uVar2;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if (phrase->_M_string_length != 0) {
    uVar2 = 0;
    do {
      produce_letter_abi_cxx11_(&local_50,this,(phrase->_M_dataplus)._M_p[uVar2]);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      uVar2 = uVar2 + 1;
    } while (uVar2 < phrase->_M_string_length);
  }
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + __return_storage_ptr__->_M_string_length);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string produce(const std::string& phrase)
        {
            std::string result;
            for (std::string::size_type i = 0; i < phrase.size(); ++i)
            {
                result += produce_letter(phrase[i]);
            }
            result = optimize(result);
            return result;
        }